

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O0

void __thiscall write_sw::operator()(write_sw *this,ogf4_slide_window *sw,xr_writer *w)

{
  xr_writer *w_local;
  ogf4_slide_window *sw_local;
  write_sw *this_local;
  
  xray_re::xr_writer::w_u32(w,sw->offset);
  xray_re::xr_writer::w_u16(w,sw->num_tris);
  xray_re::xr_writer::w_u16(w,sw->num_verts);
  return;
}

Assistant:

void operator()(const ogf4_slide_window& sw, xr_writer& w) const {
	w.w_u32(sw.offset);
	w.w_u16(sw.num_tris);
	w.w_u16(sw.num_verts);
}